

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

int proxy_load_conf(proxy_handle *ph,char *path)

{
  int iVar1;
  int ret;
  proxy_priv *priv;
  char *path_local;
  proxy_handle *ph_local;
  
  ph_local._4_4_ = conf_parse_file(path,&ph->conf,(log_handle *)((long)ph->priv + 0x860));
  if (-1 < ph_local._4_4_) {
    if ((ph->conf).connection_timeout != 0) {
      proxy_log(ph,LOG_LEVEL_WARN,"ConnectionTimeout is not supported this version of OpenELP\n");
    }
    if (((ph->conf).bind_addr_ext_add == (char **)0x0) ||
       (((ph->conf).bind_addr_ext != (char *)0x0 &&
        (iVar1 = strcmp((ph->conf).bind_addr_ext,"0.0.0.0"), iVar1 != 0)))) {
      ph_local._4_4_ = 0;
    }
    else {
      proxy_log(ph,LOG_LEVEL_ERROR,
                "ExternalBindAddresses must be specified if AdditionalExternalBindAddresses is used\n"
               );
      ph_local._4_4_ = -0x16;
    }
  }
  return ph_local._4_4_;
}

Assistant:

int proxy_load_conf(struct proxy_handle *ph, const char *path)
{
	struct proxy_priv *priv = ph->priv;
	int ret;

	ret = conf_parse_file(path, &ph->conf, &priv->log);
	if (ret < 0)
		return ret;

	if (ph->conf.connection_timeout != 0) {
		proxy_log(ph, LOG_LEVEL_WARN,
			  "ConnectionTimeout is not supported this version of OpenELP\n");
	}

	if (ph->conf.bind_addr_ext_add != NULL) {
		if (ph->conf.bind_addr_ext == NULL ||
		    strcmp(ph->conf.bind_addr_ext, "0.0.0.0") == 0) {
			proxy_log(ph, LOG_LEVEL_ERROR,
				  "ExternalBindAddresses must be specified if AdditionalExternalBindAddresses is used\n");
			return -EINVAL;
		}
	}

	return 0;
}